

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall slang::parsing::Lexer::lexTrivia<false>(Lexer *this)

{
  char cVar1;
  Lexer *this_00;
  Lexer *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  do {
    mark(in_RDI);
    cVar1 = peek(in_RDI);
    this_00 = (Lexer *)(ulong)((int)cVar1 - 9);
    switch(this_00) {
    case (Lexer *)0x0:
    case (Lexer *)0x2:
    case (Lexer *)0x3:
    case (Lexer *)0x17:
      advance(in_RDI);
      scanWhitespace(in_RDI);
      break;
    case (Lexer *)0x1:
      advance(in_RDI);
      addTrivia(in_RDI,(TriviaKind)((ulong)this_00 >> 0x38));
      break;
    case (Lexer *)0x4:
      advance(in_RDI);
      consume(this_00,(char)((uint)in_stack_ffffffffffffffe4 >> 0x18));
      addTrivia(in_RDI,(TriviaKind)((ulong)this_00 >> 0x38));
      break;
    default:
      return;
    case (Lexer *)0x26:
      cVar1 = peek(in_RDI,1);
      in_stack_ffffffffffffffe4 = (int)cVar1;
      if (in_stack_ffffffffffffffe4 == 0x2a) {
        advance(in_RDI,2);
        scanBlockComment(in_RDI);
      }
      else {
        if (in_stack_ffffffffffffffe4 != 0x2f) {
          return;
        }
        advance(in_RDI,2);
        scanLineComment((Lexer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      }
    }
  } while( true );
}

Assistant:

void Lexer::lexTrivia() {
    while (true) {
        mark();

        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                scanWhitespace();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        advance(2);
                        scanLineComment();
                        break;
                    case '*': {
                        advance(2);
                        scanBlockComment();
                        break;
                    }
                    default:
                        return;
                }
                break;
            case '\r':
                advance();
                consume('\n');
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            case '\n':
                advance();
                addTrivia(TriviaKind::EndOfLine);
                if (StopAfterNewline)
                    return;
                break;
            default:
                return;
        }
    }
}